

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

int bcf_hdr_add_sample(bcf_hdr_t *h,char *s)

{
  undefined4 uVar1;
  undefined4 uVar2;
  khint_t kVar3;
  uint uVar4;
  uint uVar5;
  kh_vdict_t *h_00;
  bcf_idinfo_t *pbVar6;
  khint32_t *pkVar7;
  ulong uVar8;
  char cVar9;
  khint_t kVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  ushort **ppuVar14;
  char *pcVar15;
  char **ppcVar16;
  sbyte sVar17;
  byte bVar18;
  undefined4 *extraout_RDX;
  uint uVar19;
  uint uVar20;
  char *__s2;
  uint uVar21;
  ulong uVar22;
  bool bVar23;
  int ret;
  int local_2c;
  
  if (s == (char *)0x0) {
    return 0;
  }
  if ((*s == '\0') && (__s2 = s, ppuVar14 = __ctype_b_loc(), (**ppuVar14 & 0x2000) == 0)) {
    bcf_hdr_add_sample_cold_2();
  }
  else {
    h_00 = (kh_vdict_t *)h->dict[2];
    pcVar15 = strdup(s);
    __s2 = pcVar15;
    kVar10 = kh_put_vdict(h_00,pcVar15,&local_2c);
    if (local_2c != 0) {
      pbVar6 = h_00->vals;
      pbVar6[(int)kVar10].hrec[2] = (bcf_hrec_t *)0x0;
      (pbVar6[(int)kVar10].hrec + 2)[1] = (bcf_hrec_t *)0xffffffff;
      pbVar6[(int)kVar10].hrec[0] = (bcf_hrec_t *)0x0;
      pbVar6[(int)kVar10].hrec[1] = (bcf_hrec_t *)0x0;
      pbVar6 = pbVar6 + (int)kVar10;
      pbVar6->info[0] = 0xf;
      pbVar6->info[1] = 0xf;
      *(undefined8 *)(pbVar6->info + 2) = 0xf;
      kVar3 = h_00->size;
      h_00->vals[(int)kVar10].id = kVar3 - 1;
      ppcVar16 = (char **)realloc(h->samples,(long)(int)kVar3 * 8);
      h->samples = ppcVar16;
      ppcVar16[(long)(int)kVar3 + -1] = pcVar15;
      h->dirty = 1;
      return 0;
    }
    if (hts_verbose < 2) {
      free(pcVar15);
      return -1;
    }
  }
  bcf_hdr_add_sample_cold_1();
  if (((kh_vdict_t *)s)->upper_bound <= ((kh_vdict_t *)s)->n_occupied) {
    uVar4 = ((kh_vdict_t *)s)->n_buckets;
    if (((kh_vdict_t *)s)->size * 2 < uVar4) {
      kVar10 = uVar4 - 1;
    }
    else {
      kVar10 = uVar4 + 1;
    }
    iVar11 = kh_resize_vdict((kh_vdict_t *)s,kVar10);
    if (iVar11 < 0) {
      *extraout_RDX = 0xffffffff;
      return ((kh_vdict_t *)s)->n_buckets;
    }
  }
  uVar4 = ((kh_vdict_t *)s)->n_buckets;
  uVar22 = (ulong)uVar4;
  uVar21 = (uint)*__s2;
  if (*__s2 == '\0') {
    uVar21 = 0;
  }
  else {
    cVar9 = __s2[1];
    if (cVar9 != '\0') {
      pcVar15 = __s2 + 2;
      do {
        uVar21 = (int)cVar9 + uVar21 * 0x1f;
        cVar9 = *pcVar15;
        pcVar15 = pcVar15 + 1;
      } while (cVar9 != '\0');
    }
  }
  uVar21 = uVar21 & uVar4 - 1;
  pkVar7 = ((kh_vdict_t *)s)->flags;
  if ((pkVar7[uVar21 >> 4] >> ((char)uVar21 * '\x02' & 0x1fU) & 2) == 0) {
    iVar11 = 1;
    uVar19 = uVar21;
    do {
      uVar5 = pkVar7[uVar19 >> 4];
      uVar20 = uVar19 * 2 & 0x1e;
      sVar17 = (sbyte)uVar20;
      uVar12 = uVar5 >> sVar17;
      if (((uVar12 & 2) != 0) ||
         (((uVar12 & 1) == 0 && (iVar13 = strcmp(((kh_vdict_t *)s)->keys[uVar19],__s2), iVar13 == 0)
          ))) {
        bVar23 = (uVar5 >> sVar17 & 2) == 0;
        uVar21 = (uint)uVar22;
        goto LAB_001138e9;
      }
      if ((uVar5 >> uVar20 & 1) != 0) {
        uVar22 = (ulong)uVar19;
      }
      uVar19 = uVar19 + iVar11 & uVar4 - 1;
      iVar11 = iVar11 + 1;
    } while (uVar19 != uVar21);
    bVar23 = true;
    uVar19 = uVar21;
    uVar21 = uVar4;
    if ((uint)uVar22 == uVar4) {
LAB_001138e9:
      if (uVar21 == uVar4) {
        uVar21 = uVar19;
      }
      if (bVar23) {
        uVar21 = uVar19;
      }
      uVar22 = (ulong)uVar21;
    }
  }
  else {
    uVar22 = (ulong)uVar21;
  }
  uVar8 = uVar22 >> 4;
  bVar18 = (char)uVar22 * '\x02' & 0x1e;
  if ((pkVar7[uVar8] >> bVar18 & 2) == 0) {
    if ((pkVar7[uVar8] >> bVar18 & 1) == 0) {
      *extraout_RDX = 0;
    }
    else {
      ((kh_vdict_t *)s)->keys[uVar22] = __s2;
      ((kh_vdict_t *)s)->flags[uVar8] = ((kh_vdict_t *)s)->flags[uVar8] & ~(3 << bVar18);
      ((kh_vdict_t *)s)->size = ((kh_vdict_t *)s)->size + 1;
      *extraout_RDX = 2;
    }
  }
  else {
    ((kh_vdict_t *)s)->keys[uVar22] = __s2;
    ((kh_vdict_t *)s)->flags[uVar8] = ((kh_vdict_t *)s)->flags[uVar8] & ~(3 << bVar18);
    uVar1 = ((kh_vdict_t *)s)->size;
    uVar2 = ((kh_vdict_t *)s)->n_occupied;
    ((kh_vdict_t *)s)->size = uVar1 + 1;
    ((kh_vdict_t *)s)->n_occupied = uVar2 + 1;
    *extraout_RDX = 1;
  }
  return (int)uVar22;
}

Assistant:

int bcf_hdr_add_sample(bcf_hdr_t *h, const char *s)
{
    if ( !s ) return 0;

    const char *ss = s;
    while ( !*ss && isspace(*ss) ) ss++;
    if ( !*ss )
    {
        fprintf(stderr,"[E::%s] Empty sample name: trailing spaces/tabs in the header line?\n", __func__);
        abort();
    }

    vdict_t *d = (vdict_t*)h->dict[BCF_DT_SAMPLE];
    int ret;
    char *sdup = strdup(s);
    int k = kh_put(vdict, d, sdup, &ret);
    if (ret) { // absent
        kh_val(d, k) = bcf_idinfo_def;
        kh_val(d, k).id = kh_size(d) - 1;
    } else {
        if (hts_verbose >= 2)
        {
            fprintf(stderr, "[E::%s] Duplicated sample name '%s'\n", __func__, s);
            abort();
        }
        free(sdup);
        return -1;
    }
    int n = kh_size(d);
    h->samples = (char**) realloc(h->samples,sizeof(char*)*n);
    h->samples[n-1] = sdup;
    h->dirty = 1;
    return 0;
}